

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.h
# Opt level: O0

void __thiscall
ContainerToReaderWrapper::ContainerToReaderWrapper
          (ContainerToReaderWrapper *this,METADemuxer *owner,BufferedReaderManager *readManager)

{
  uint32_t uVar1;
  BufferedReaderManager *brm;
  BufferedReaderManager *readManager_local;
  METADemuxer *owner_local;
  ContainerToReaderWrapper *this_local;
  
  AbstractReader::AbstractReader(&this->super_AbstractReader);
  (this->super_AbstractReader)._vptr_AbstractReader =
       (_func_int **)&PTR__ContainerToReaderWrapper_00441650;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
  ::map(&this->m_demuxers);
  this->m_readBuffOffset = 0;
  this->m_readManager = readManager;
  std::
  map<unsigned_int,_ContainerToReaderWrapper::ReaderInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
  ::map(&this->m_readerInfo);
  this->m_owner = owner;
  uVar1 = BufferedReaderManager::getBlockSize(readManager);
  (this->super_AbstractReader).m_blockSize = uVar1;
  uVar1 = BufferedReaderManager::getAllocSize(readManager);
  (this->super_AbstractReader).m_allocSize = uVar1;
  uVar1 = BufferedReaderManager::getPreReadThreshold(readManager);
  (this->super_AbstractReader).m_prereadThreshold = uVar1;
  this->m_readerCnt = 0;
  this->m_discardedSize = 0;
  this->m_terminated = false;
  return;
}

Assistant:

ContainerToReaderWrapper(const METADemuxer& owner, const BufferedReaderManager& readManager)
        : m_readBuffOffset(0), m_readManager(readManager), m_owner(owner)
    {
        const auto& brm = const_cast<BufferedReaderManager&>(readManager);

        m_blockSize = brm.getBlockSize();
        m_allocSize = brm.getAllocSize();
        m_prereadThreshold = brm.getPreReadThreshold();

        m_readerCnt = 0;
        m_discardedSize = 0;
        m_terminated = false;
    }